

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

void __thiscall
Well<unsigned_int,32ul,726ul,23ul,610ul,175ul,662ul,Detail::M4<2831324881u>,Detail::M1,Detail::M6<32ul,15u,1567311308u,4294901759u,2u>,Detail::M3<-24>,Detail::M3<-26>,Detail::M1,Detail::M0,Detail::M3<16>,Detail::NoTempering>
::seed<unsigned_int*>
          (Well<unsigned_int,32ul,726ul,23ul,610ul,175ul,662ul,Detail::M4<2831324881u>,Detail::M1,Detail::M6<32ul,15u,1567311308u,4294901759u,2u>,Detail::M3<_24>,Detail::M3<_26>,Detail::M1,Detail::M0,Detail::M3<16>,Detail::NoTempering>
           *this,uint **first,uint *last)

{
  invalid_argument *this_00;
  bool bVar1;
  long local_28;
  size_t i;
  uint *last_local;
  uint **first_local;
  Well<unsigned_int,_32UL,_726UL,_23UL,_610UL,_175UL,_662UL,_Detail::M4<2831324881U>,_Detail::M1,_Detail::M6<32UL,_15U,_1567311308U,_4294901759U,_2U>,_Detail::M3<_24>,_Detail::M3<_26>,_Detail::M1,_Detail::M0,_Detail::M3<16>,_Detail::NoTempering>
  *this_local;
  
  *(undefined8 *)(this + 0xb58) = 0;
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 != 0x2d6) {
      bVar1 = *first != last;
    }
    if (!bVar1) break;
    *(uint *)(this + local_28 * 4) = **first;
    local_28 = local_28 + 1;
    *first = *first + 1;
  }
  if ((*first == last) && (local_28 != 0x2d6)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Seed sequence too short");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void seed(InputIterator& first, InputIterator last)
    {
        index_ = 0;
        std::size_t i = 0;

        for ( ; i != state_size && first != last; ++i, ++first)
            state_[i] = *first;

        if (first == last && i != state_size)
            throw std::invalid_argument("Seed sequence too short");
    }